

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UBOBindingRenderCase::iterate(UBOBindingRenderCase *this)

{
  code *pcVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  reference pvVar9;
  undefined8 uVar10;
  TestLog *this_00;
  MessageBuilder *pMVar11;
  reference expectedColor;
  bool local_1e9;
  int local_1e4;
  int arrayNdx;
  int drawCycle;
  int local_50;
  value_type local_4c;
  GLint val;
  GLint binding;
  string name;
  int iterNdx;
  bool imageTestPassed;
  bool queryTestPassed;
  GLint GStack_1c;
  bool arrayInstance;
  GLenum prop;
  int iterations;
  Functions *gl;
  UBOBindingRenderCase *this_local;
  
  gl = (Functions *)this;
  pRVar8 = Context::getRenderContext((this->super_LayoutBindingRenderCase).super_TestCase.m_context)
  ;
  iVar4 = (*pRVar8->_vptr_RenderContext[3])();
  _prop = CONCAT44(extraout_var,iVar4);
  GStack_1c = (this->super_LayoutBindingRenderCase).m_numBindings;
  iterNdx = 0x9302;
  local_1e9 = true;
  if ((this->super_LayoutBindingRenderCase).m_testType != TESTTYPE_BINDING_ARRAY) {
    local_1e9 = (this->super_LayoutBindingRenderCase).m_testType == TESTTYPE_BINDING_MAX_ARRAY;
  }
  name.field_2._M_local_buf[0xf] = local_1e9;
  name.field_2._M_local_buf[0xe] = '\x01';
  name.field_2._M_local_buf[0xd] = '\x01';
  LayoutBindingRenderCase::initRenderState(&this->super_LayoutBindingRenderCase);
  for (name.field_2._8_4_ = 0; (int)name.field_2._8_4_ < GStack_1c;
      name.field_2._8_4_ = name.field_2._8_4_ + 1) {
    if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
      getUniformName((string *)&val,&(this->super_LayoutBindingRenderCase).m_uniformName,
                     name.field_2._8_4_);
    }
    else {
      getUniformName((string *)&val,&(this->super_LayoutBindingRenderCase).m_uniformName,0,
                     name.field_2._8_4_);
    }
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingRenderCase).m_bindings,
                        (long)(int)name.field_2._8_4_);
    local_4c = *pvVar9;
    local_50 = -1;
    pcVar1 = *(code **)(_prop + 0x9c8);
    dVar5 = glu::ShaderProgram::getProgram((this->super_LayoutBindingRenderCase).m_program);
    pcVar2 = *(code **)(_prop + 0x9a8);
    dVar6 = glu::ShaderProgram::getProgram((this->super_LayoutBindingRenderCase).m_program);
    uVar10 = std::__cxx11::string::c_str();
    uVar7 = (*pcVar2)(dVar6,0x92e2,uVar10);
    (*pcVar1)(dVar5,0x92e2,uVar7,1,&iterNdx,1,0,&local_50);
    this_00 = tcu::TestContext::getLog
                        ((this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&arrayNdx,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&arrayNdx,(char (*) [28])"Querying binding point for ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&val);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0xf96de6);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_50);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [5])0xf35cc4);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_4c);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&arrayNdx);
    dVar5 = (**(code **)(_prop + 0x800))();
    glu::checkError(dVar5,"Binding point query failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                    ,0x6d0);
    if (local_50 != local_4c) {
      name.field_2._M_local_buf[0xe] = '\0';
    }
    for (local_1e4 = 0; local_1e4 < 2; local_1e4 = local_1e4 + 1) {
      iVar4 = local_1e4 + name.field_2._8_4_ * 2;
      (**(code **)(_prop + 0x14f0))
                ((this->super_LayoutBindingRenderCase).m_shaderProgramArrayNdxLoc,iVar4);
      expectedColor =
           std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&this->m_expectedColors,(long)iVar4);
      bVar3 = LayoutBindingRenderCase::drawAndVerifyResult
                        (&this->super_LayoutBindingRenderCase,expectedColor);
      if (!bVar3) {
        name.field_2._M_local_buf[0xd] = '\0';
      }
    }
    std::__cxx11::string::~string((string *)&val);
  }
  LayoutBindingRenderCase::setTestResult
            (&this->super_LayoutBindingRenderCase,(bool)(name.field_2._M_local_buf[0xe] & 1),
             (bool)(name.field_2._M_local_buf[0xd] & 1));
  return STOP;
}

Assistant:

TestCase::IterateResult UBOBindingRenderCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const int				iterations		= m_numBindings;
	const glw::GLenum		prop			= GL_BUFFER_BINDING;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	bool					queryTestPassed	= true;
	bool					imageTestPassed = true;

	// Set the viewport and enable the shader program
	initRenderState();

	for (int iterNdx = 0; iterNdx < iterations; ++iterNdx)
	{
		// Query binding point
		const std::string	name	= (arrayInstance ? getUniformName(m_uniformName, 0, iterNdx) : getUniformName(m_uniformName, iterNdx));
		const glw::GLint	binding = m_bindings[iterNdx];
		glw::GLint			val		= -1;

		gl.getProgramResourceiv(m_program->getProgram(), GL_UNIFORM_BLOCK, gl.getProgramResourceIndex(m_program->getProgram(), GL_UNIFORM_BLOCK, name.c_str() ), 1, &prop, 1, DE_NULL, &val);
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying binding point for " << name << ": " << val << " == " << binding << tcu::TestLog::EndMessage;
		GLU_EXPECT_NO_ERROR(gl.getError(), "Binding point query failed");

		if (val != binding)
			queryTestPassed = false;

		// Draw twice to render both colors within the UBO
		for (int drawCycle = 0; drawCycle < 2; ++drawCycle)
		{
			// Set the uniform indicating the array index to be used and set the expected color
			const int arrayNdx = iterNdx*2 + drawCycle;
			gl.uniform1i(m_shaderProgramArrayNdxLoc, arrayNdx);

			if (!drawAndVerifyResult(m_expectedColors[arrayNdx]))
				imageTestPassed = false;
		}
	}

	setTestResult(queryTestPassed, imageTestPassed);
	return STOP;
}